

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDComponentPtr::ClearStates(ON_SubDComponentPtr *this,ON_ComponentStatus states_to_clear)

{
  Type TVar1;
  uint uVar2;
  ON__UINT_PTR OVar3;
  bool bVar4;
  
  TVar1 = ComponentType(this);
  if (TVar1 == Face) {
    OVar3 = this->m_ptr;
    bVar4 = (~(uint)OVar3 & 6) == 0;
  }
  else if (TVar1 == Edge) {
    OVar3 = this->m_ptr;
    bVar4 = ((uint)OVar3 & 6) == 4;
  }
  else {
    if (TVar1 != Vertex) goto LAB_005cd570;
    OVar3 = this->m_ptr;
    bVar4 = ((uint)OVar3 & 6) == 2;
  }
  if ((OVar3 & 0xfffffffffffffff8) != 0 && bVar4) {
    uVar2 = ON_ComponentStatus::ClearStates
                      ((ON_ComponentStatus *)((OVar3 & 0xfffffffffffffff8) + 0x10),states_to_clear);
    return uVar2;
  }
LAB_005cd570:
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

unsigned int ON_SubDComponentPtr::ClearStates(
  ON_ComponentStatus states_to_clear
  )
{
  switch (ComponentType())
  {
  case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* vertex = Vertex();
      if (nullptr != vertex)
        return vertex->m_status.ClearStates(states_to_clear);
    }
    break;
  case ON_SubDComponentPtr::Type::Edge:
    {
      const ON_SubDEdge* edge = Edge();
      if (nullptr != edge)
        return edge->m_status.ClearStates(states_to_clear);
    }
    break;
  case ON_SubDComponentPtr::Type::Face:
    {
      const ON_SubDFace* face = Face();
      if (nullptr != face)
        return face->m_status.ClearStates(states_to_clear);
    }
    break;
  case ON_SubDComponentPtr::Type::Unset:
    break;
  }
  return ON_SUBD_RETURN_ERROR(0);
}